

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::anon_unknown_35::FailureTest::TestBody(FailureTest *this)

{
  ostream *poVar1;
  AssertHelper local_20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18;
  
  if (this->as_error_ == true) {
    Message::Message((Message *)&local_18);
    std::operator<<((ostream *)(local_18._M_head_impl + 0x10),(string *)&this->error_message_);
    AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,(this->loc_).file._M_dataplus._M_p,(this->loc_).line,"");
    AssertHelper::operator=(&local_20,(Message *)&local_18);
    AssertHelper::~AssertHelper(&local_20);
    if (local_18._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_18._M_head_impl + 8))();
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->error_message_);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void TestBody() override {
    if (as_error_) {
      AssertHelper(TestPartResult::kNonFatalFailure, loc_.file.c_str(),
                   loc_.line, "") = Message() << error_message_;
    } else {
      std::cout << error_message_ << std::endl;
    }
  }